

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

bool P_TestMobjLocation(AActor *mobj)

{
  uint uVar1;
  bool bVar2;
  double dVar3;
  DVector2 local_28;
  
  uVar1 = (mobj->flags).Value;
  (mobj->flags).Value = uVar1 & 0xfffff7ff;
  local_28.X = (mobj->__Pos).X;
  local_28.Y = (mobj->__Pos).Y;
  bVar2 = P_CheckPosition(mobj,&local_28,false);
  if (bVar2) {
    (mobj->flags).Value = uVar1;
    dVar3 = (mobj->__Pos).Z;
    if ((mobj->floorz <= dVar3) &&
       (dVar3 = dVar3 + mobj->Height, dVar3 < mobj->ceilingz || dVar3 == mobj->ceilingz)) {
      return true;
    }
  }
  else {
    (mobj->flags).Value = uVar1;
  }
  return false;
}

Assistant:

bool P_TestMobjLocation(AActor *mobj)
{
	ActorFlags flags;

	flags = mobj->flags;
	mobj->flags &= ~MF_PICKUP;
	if (P_CheckPosition(mobj, mobj->Pos()))
	{ // XY is ok, now check Z
		mobj->flags = flags;
		if ((mobj->Z() < mobj->floorz) || (mobj->Top() > mobj->ceilingz))
		{ // Bad Z
			return false;
		}
		return true;
	}
	mobj->flags = flags;
	return false;
}